

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O2

bool __thiscall Am_Value::operator!=(Am_Value *this,Am_Method_Wrapper *test_value)

{
  ushort uVar1;
  bool bVar2;
  
  uVar1 = this->type;
  if ((uVar1 & 0x7000) == 0x3000) {
    bVar2 = (Am_Method_Wrapper *)(this->value).wrapper_value == test_value;
  }
  else {
    if (10 < uVar1) {
      return true;
    }
    if ((0x60cU >> (uVar1 & 0x1f) & 1) == 0) {
      return true;
    }
    bVar2 = test_value == (Am_Method_Wrapper *)0x0 &&
            (this->value).wrapper_value == (Am_Wrapper *)0x0;
  }
  return !bVar2;
}

Assistant:

bool
Am_Value::operator!=(Am_Method_Wrapper *test_value) const
{
  if (Am_Type_Class(type) == Am_METHOD)
    return value.method_value != test_value;
  switch (type) {
  case Am_PROC:
  case Am_INT:
  case Am_LONG:
  case Am_VOIDPTR:
    return value.voidptr_value || test_value;
  default:
    return true;
  }
}